

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QString,QPollingFileSystemWatcherEngine::FileInfo>::
emplace_helper<QPollingFileSystemWatcherEngine::FileInfo_const&>
          (QHash<QString,QPollingFileSystemWatcherEngine::FileInfo> *this,QString *key,
          FileInfo *args)

{
  piter pVar1;
  Node<QString,_QPollingFileSystemWatcherEngine::FileInfo> *n;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QString,_QPollingFileSystemWatcherEngine::FileInfo>_>::
  findOrInsert<QString>
            ((InsertionResult *)local_38,
             *(Data<QHashPrivate::Node<QString,_QPollingFileSystemWatcherEngine::FileInfo>_> **)this
             ,key);
  n = (Node<QString,_QPollingFileSystemWatcherEngine::FileInfo> *)
      ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
      (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
      [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    QHashPrivate::Node<QString,QPollingFileSystemWatcherEngine::FileInfo>::
    createInPlace<QPollingFileSystemWatcherEngine::FileInfo_const&>(n,key,args);
  }
  else {
    QHashPrivate::Node<QString,QPollingFileSystemWatcherEngine::FileInfo>::
    emplaceValue<QPollingFileSystemWatcherEngine::FileInfo_const&>
              ((Node<QString,QPollingFileSystemWatcherEngine::FileInfo> *)n,args);
  }
  pVar1.bucket = local_38._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<QString,_QPollingFileSystemWatcherEngine::FileInfo>_> *)
            local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }